

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringUtilities.h
# Opt level: O0

string * __thiscall
soul::joinStrings<soul::ArrayWithPreallocation<soul::Identifier,8ul>>
          (string *__return_storage_ptr__,soul *this,
          ArrayWithPreallocation<soul::Identifier,_8UL> *strings,string *separator)

{
  bool bVar1;
  Identifier *pIVar2;
  size_t sVar3;
  ulong local_40;
  size_t i;
  allocator<char> local_22;
  undefined1 local_21;
  ArrayWithPreallocation<soul::Identifier,_8UL> *local_20;
  string *separator_local;
  ArrayWithPreallocation<soul::Identifier,_8UL> *strings_local;
  string *s;
  
  local_20 = strings;
  separator_local = (string *)this;
  strings_local = (ArrayWithPreallocation<soul::Identifier,_8UL> *)__return_storage_ptr__;
  bVar1 = ArrayWithPreallocation<soul::Identifier,_8UL>::empty
                    ((ArrayWithPreallocation<soul::Identifier,_8UL> *)this);
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    local_21 = 0;
    pIVar2 = ArrayWithPreallocation<soul::Identifier,_8UL>::front
                       ((ArrayWithPreallocation<soul::Identifier,_8UL> *)separator_local);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<soul::Identifier,void>
              ((string *)__return_storage_ptr__,pIVar2,&local_22);
    std::allocator<char>::~allocator(&local_22);
    for (local_40 = 1;
        sVar3 = ArrayWithPreallocation<soul::Identifier,_8UL>::size
                          ((ArrayWithPreallocation<soul::Identifier,_8UL> *)separator_local),
        local_40 < sVar3; local_40 = local_40 + 1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_20);
      pIVar2 = ArrayWithPreallocation<soul::Identifier,_8UL>::operator[]
                         ((ArrayWithPreallocation<soul::Identifier,_8UL> *)separator_local,local_40)
      ;
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pIVar2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string joinStrings (const StringArray& strings, const std::string& separator)
{
    if (strings.empty())
        return {};

    std::string s (strings.front());

    for (size_t i = 1; i < strings.size(); ++i)
    {
        s += separator;
        s += strings[i];
    }

    return s;
}